

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall QWidget::isAncestorOf(QWidget *this,QWidget *child)

{
  while( true ) {
    if (child == (QWidget *)0x0) {
      return false;
    }
    if (child == this) break;
    if (((child->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      return false;
    }
    child = *(QWidget **)(*(long *)&child->field_0x8 + 0x10);
  }
  return true;
}

Assistant:

bool QWidget::isAncestorOf(const QWidget *child) const
{
    while (child) {
        if (child == this)
            return true;
        if (child->isWindow())
            return false;
        child = child->parentWidget();
    }
    return false;
}